

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::AudioTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               AudioTrack **pResult)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  int iVar3;
  long lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  AudioTrack *this;
  long lVar8;
  longlong pos;
  longlong size;
  double local_70;
  double rate;
  AudioTrack **local_60;
  Segment *local_58;
  longlong local_50;
  longlong local_48;
  Info *local_40;
  longlong id;
  
  lVar8 = -1;
  if ((*pResult == (AudioTrack *)0x0) && (info->type == 2)) {
    pReader = pSegment->m_pReader;
    pos = (info->settings).start;
    lVar8 = (info->settings).size + pos;
    rate = 8000.0;
    lVar6 = 1;
    local_70 = 8000.0;
    lVar5 = 0;
    local_60 = pResult;
    local_58 = pSegment;
    local_50 = element_start;
    local_48 = element_size;
    local_40 = info;
    do {
      if (lVar8 <= pos) {
        if (pos != lVar8) {
          return -2;
        }
        this = (AudioTrack *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
        if (this == (AudioTrack *)0x0) {
          return -1;
        }
        AudioTrack(this,local_58,local_50,local_48);
        iVar3 = Track::Info::Copy(local_40,&(this->super_Track).m_info);
        if (iVar3 != 0) {
          (*(this->super_Track)._vptr_Track[1])(this);
          return -1;
        }
        this->m_rate = local_70;
        this->m_channels = lVar6;
        this->m_bitDepth = lVar5;
        *local_60 = this;
        return 0;
      }
      lVar4 = ParseElementHeader(pReader,&pos,lVar8,&id,&size);
      lVar2 = size;
      lVar1 = pos;
      if (lVar4 < 0) {
        return lVar4;
      }
      if (id == 0x9f) {
        lVar6 = UnserializeUInt(pReader,pos,size);
        lVar7 = lVar6;
joined_r0x001604e0:
        if (lVar7 < 1) break;
      }
      else if (id == 0xb5) {
        lVar4 = UnserializeFloat(pReader,pos,size,&rate);
        if (lVar4 < 0) {
          return lVar4;
        }
        local_70 = rate;
        if (rate <= 0.0) break;
      }
      else if (id == 0x6264) {
        lVar5 = UnserializeUInt(pReader,pos,size);
        lVar7 = lVar5;
        goto joined_r0x001604e0;
      }
      pos = lVar1 + lVar2;
    } while (pos <= lVar8);
    lVar8 = -2;
  }
  return lVar8;
}

Assistant:

long AudioTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       AudioTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kAudio)
    return -1;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  double rate = 8000.0;  // MKV default
  long long channels = 1;
  long long bit_depth = 0;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSamplingFrequency) {
      status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvChannels) {
      channels = UnserializeUInt(pReader, pos, size);

      if (channels <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvBitDepth) {
      bit_depth = UnserializeUInt(pReader, pos, size);

      if (bit_depth <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  AudioTrack* const pTrack =
      new (std::nothrow) AudioTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {
    delete pTrack;
    return status;
  }

  pTrack->m_rate = rate;
  pTrack->m_channels = channels;
  pTrack->m_bitDepth = bit_depth;

  pResult = pTrack;
  return 0;  // success
}